

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::find_child_by_attribute(xml_node *this,char_t *attr_name,char_t *attr_value)

{
  bool bVar1;
  char *local_60;
  char_t *avalue;
  char_t *aname;
  xml_attribute_struct *a;
  xml_node_struct *i;
  char_t *attr_value_local;
  char_t *attr_name_local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node((xml_node *)&this_local);
  }
  else {
    for (a = (xml_attribute_struct *)this->_root->first_child; a != (xml_attribute_struct *)0x0;
        a = (xml_attribute_struct *)a[1].name) {
      for (aname = a[1].value; aname != (char_t *)0x0; aname = *(char_t **)(aname + 0x20)) {
        if ((*(char_t **)(aname + 8) != (char_t *)0x0) &&
           (bVar1 = impl::anon_unknown_0::strequal(attr_name,*(char_t **)(aname + 8)), bVar1)) {
          local_60 = *(char **)(aname + 0x10);
          if (local_60 == (char_t *)0x0) {
            local_60 = "";
          }
          bVar1 = impl::anon_unknown_0::strequal(attr_value,local_60);
          if (bVar1) {
            xml_node((xml_node *)&this_local,(xml_node_struct *)a);
            return (xml_node)(xml_node_struct *)this_local;
          }
        }
      }
    }
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
			{
				const char_t* aname = a->name;
				if (aname && impl::strequal(attr_name, aname))
				{
					const char_t* avalue = a->value;
					if (impl::strequal(attr_value, avalue ? avalue : PUGIXML_TEXT("")))
						return xml_node(i);
				}
			}

		return xml_node();
	}